

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ZSTD_compressionParameters *cParams;
  BYTE *pInLimit;
  uint uVar1;
  uint uVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 UVar8;
  uint uVar9;
  size_t sVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int *piVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  int *ip;
  int *piVar17;
  ulong uVar18;
  int iVar19;
  bool bVar20;
  uint local_bc;
  ulong local_a8;
  
  pInLimit = (BYTE *)((long)src + srcSize);
  piVar14 = (int *)((long)src + (srcSize - 8));
  pBVar15 = (ms->window).base + (ms->window).dictLimit;
  uVar1 = *rep;
  uVar2 = rep[1];
  iVar19 = (int)pBVar15;
  ip = (int *)((ulong)((int)src == iVar19) + (long)src);
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar6 = (int)ip - iVar19;
  local_bc = uVar2;
  if (uVar6 < uVar2) {
    local_bc = 0;
  }
  uVar13 = (ulong)uVar1;
  if (uVar6 < uVar1) {
    uVar13 = 0;
  }
  cParams = &ms->cParams;
  do {
    uVar11 = (uint)uVar13;
    while( true ) {
      if (piVar14 <= ip) {
        uVar9 = 0;
        if (uVar6 < uVar2) {
          uVar9 = uVar2;
        }
        if (uVar6 < uVar1) {
          uVar9 = uVar1;
        }
        if (uVar11 == 0) {
          uVar11 = uVar9;
        }
        if (local_bc != 0) {
          uVar9 = local_bc;
        }
        *rep = uVar11;
        rep[1] = uVar9;
        return (long)pInLimit - (long)src;
      }
      if ((uVar11 != 0) && (*(int *)((long)ip + -uVar13 + 1) == *(int *)((long)ip + 1))) {
        piVar17 = (int *)((long)ip + 1);
        sVar10 = ZSTD_count((BYTE *)((long)ip + 5),(BYTE *)((long)ip + -uVar13 + 5),pInLimit);
        uVar18 = sVar10 + 4;
        UVar8 = 0;
        goto LAB_00130f8b;
      }
      uVar9 = (ms->cParams).minMatch;
      iVar19 = (int)ip;
      if (uVar9 - 6 < 2) {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar12 = iVar19 - (int)pBVar4;
        uVar5 = uVar12 - uVar7;
        if (uVar12 < uVar7) {
          uVar5 = 0;
        }
        iVar19 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
        local_a8 = 999999999;
        uVar18 = 3;
        while( true ) {
          bVar20 = iVar19 == 0;
          iVar19 = iVar19 + -1;
          if ((((UVar8 <= uVar9) || (bVar20)) ||
              ((pBVar16 = pBVar4 + UVar8, pBVar16[uVar18] == *(BYTE *)((long)ip + uVar18) &&
               ((sVar10 = ZSTD_count((BYTE *)ip,pBVar16,pInLimit), uVar18 < sVar10 &&
                (local_a8 = (ulong)((uVar12 + 2) - UVar8), uVar18 = sVar10,
                (BYTE *)(sVar10 + (long)ip) == pInLimit)))))) || (UVar8 <= uVar5)) break;
          UVar8 = pUVar3[UVar8 & uVar7 - 1];
        }
      }
      else if (uVar9 == 5) {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar12 = iVar19 - (int)pBVar4;
        uVar5 = uVar12 - uVar7;
        if (uVar12 < uVar7) {
          uVar5 = 0;
        }
        iVar19 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
        local_a8 = 999999999;
        uVar18 = 3;
        while( true ) {
          bVar20 = iVar19 == 0;
          iVar19 = iVar19 + -1;
          if ((((UVar8 <= uVar9) || (bVar20)) ||
              ((pBVar16 = pBVar4 + UVar8, pBVar16[uVar18] == *(BYTE *)((long)ip + uVar18) &&
               ((sVar10 = ZSTD_count((BYTE *)ip,pBVar16,pInLimit), uVar18 < sVar10 &&
                (local_a8 = (ulong)((uVar12 + 2) - UVar8), uVar18 = sVar10,
                (BYTE *)(sVar10 + (long)ip) == pInLimit)))))) || (UVar8 <= uVar5)) break;
          UVar8 = pUVar3[UVar8 & uVar7 - 1];
        }
      }
      else {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar12 = iVar19 - (int)pBVar4;
        uVar5 = uVar12 - uVar7;
        if (uVar12 < uVar7) {
          uVar5 = 0;
        }
        iVar19 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
        local_a8 = 999999999;
        uVar18 = 3;
        while( true ) {
          bVar20 = iVar19 == 0;
          iVar19 = iVar19 + -1;
          if (((UVar8 <= uVar9) || (bVar20)) ||
             (((pBVar16 = pBVar4 + UVar8, pBVar16[uVar18] == *(BYTE *)((long)ip + uVar18) &&
               ((sVar10 = ZSTD_count((BYTE *)ip,pBVar16,pInLimit), uVar18 < sVar10 &&
                (local_a8 = (ulong)((uVar12 + 2) - UVar8), uVar18 = sVar10,
                (BYTE *)(sVar10 + (long)ip) == pInLimit)))) || (UVar8 <= uVar5)))) break;
          UVar8 = pUVar3[UVar8 & uVar7 - 1];
        }
      }
      if (3 < uVar18) break;
      ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
    }
    if (local_a8 == 0) {
      UVar8 = 0;
      piVar17 = ip;
    }
    else {
      for (; ((src < ip && (pBVar15 < (BYTE *)((long)ip + (2 - local_a8)))) &&
             (*(char *)((long)ip + -1) == *(char *)((long)ip + (1 - local_a8))));
          ip = (int *)((long)ip + -1)) {
        uVar18 = uVar18 + 1;
      }
      UVar8 = (U32)local_a8;
      uVar13 = (ulong)(UVar8 - 2);
      piVar17 = ip;
      local_bc = uVar11;
    }
LAB_00130f8b:
    ZSTD_storeSeq(seqStore,(long)piVar17 - (long)src,src,UVar8,uVar18 - 3);
    for (ip = (int *)((long)piVar17 + uVar18);
        ((src = ip, local_bc != 0 && (ip <= piVar14)) &&
        (*ip == *(int *)((long)ip - (ulong)local_bc))); ip = (int *)((long)ip + sVar10 + 4)) {
      sVar10 = ZSTD_count((BYTE *)(ip + 1),(BYTE *)((long)ip + (4 - (ulong)local_bc)),pInLimit);
      ZSTD_storeSeq(seqStore,0,ip,0,sVar10 + 1);
      uVar18 = (ulong)local_bc;
      local_bc = (uint)uVar13;
      uVar13 = uVar18;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 0, ZSTD_noDict);
}